

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O1

uint RDL_countURFs(RDL_URFinfo *uInfo)

{
  uint *puVar1;
  long lVar2;
  bool bVar3;
  void *__ptr;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = (ulong)uInfo->nofWeights;
  __ptr = malloc(uVar5 * 8);
  if (uVar5 != 0) {
    puVar1 = uInfo->nofProtos;
    uVar8 = 0;
    do {
      pvVar4 = malloc((ulong)puVar1[uVar8]);
      *(void **)((long)__ptr + uVar8 * 8) = pvVar4;
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  if (uInfo->nofWeights != 0) {
    uVar5 = 0;
    do {
      if (uInfo->nofProtos[uVar5] != 0) {
        lVar2 = *(long *)((long)__ptr + uVar5 * 8);
        uVar8 = 0;
        do {
          *(undefined1 *)(lVar2 + uVar8) = 0;
          uVar8 = uVar8 + 1;
        } while (uVar8 < uInfo->nofProtos[uVar5]);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uInfo->nofWeights);
  }
  if (uInfo->nofWeights == 0) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    do {
      if (uInfo->nofProtos[uVar5] != 0) {
        lVar2 = *(long *)((long)__ptr + uVar5 * 8);
        uVar8 = 0;
        do {
          if (((*(char *)(lVar2 + uVar8) != '\x01') && (uInfo->URFrel[uVar5][uVar8][uVar8] != '\0'))
             && (uVar8 < uInfo->nofProtos[uVar5])) {
            bVar3 = false;
            uVar7 = uVar8;
            do {
              if (uInfo->URFrel[uVar5][uVar8][uVar7] == '\x01') {
                *(undefined1 *)(lVar2 + uVar7) = 1;
                uVar6 = uVar6 + !bVar3;
                bVar3 = true;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < uInfo->nofProtos[uVar5]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uInfo->nofProtos[uVar5]);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uInfo->nofWeights);
  }
  if (uInfo->nofWeights != 0) {
    uVar5 = 0;
    do {
      free(*(void **)((long)__ptr + uVar5 * 8));
      uVar5 = uVar5 + 1;
    } while (uVar5 < uInfo->nofWeights);
  }
  free(__ptr);
  return uVar6;
}

Assistant:

unsigned RDL_countURFs(RDL_URFinfo *uInfo)
{
  unsigned URFRelCount=0, weightIdx, i, j;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/
  char increase;

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  /*count number of 1s indicating URF-relation*/
  for(weightIdx=0; weightIdx<uInfo->nofWeights; ++weightIdx)
  {
    for(i=0; i<uInfo->nofProtos[weightIdx]; ++i)
    {
      if(alreadyInURF[weightIdx][i] == 1 || uInfo->URFrel[weightIdx][i][i] == 0)
      {
        continue;
      }
      increase = 0;
      for(j=i; j<uInfo->nofProtos[weightIdx]; ++j)
      {
        if(uInfo->URFrel[weightIdx][i][j] == 1)
        {
          alreadyInURF[weightIdx][j] = 1;
          if(increase == 0)
          {
            ++URFRelCount;
            increase = 1;
          }
        }
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  return URFRelCount;
}